

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_pubkey_ok_rsa_encrypted.c
# Opt level: O3

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  
  iVar1 = test_auth_pubkey(session,0,"libssh2","libssh2","key_rsa_encrypted.pub","key_rsa_encrypted"
                          );
  return iVar1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
#if LIBSSH2_RSA_SHA1
    /* set in Dockerfile */
    return test_auth_pubkey(session, 0,
                            "libssh2",
                            "libssh2",
                            "key_rsa_encrypted.pub",
                            "key_rsa_encrypted");
#else
    (void)session;
    return 0;
#endif
}